

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O3

size_t miniscript::internal::ComputeScriptLen
                 (Fragment fragment,Type sub0typ,size_t subsize,uint32_t k,size_t n_subs,
                 size_t n_keys,MiniscriptContext ms_ctx)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  size_t local_70;
  uint32_t local_64;
  direct_or_indirect local_60;
  uint local_44;
  direct_or_indirect local_40;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = 1;
  local_70 = n_keys;
  local_64 = k;
  switch(fragment) {
  case JUST_0:
  case JUST_1:
    break;
  case PK_K:
    sVar3 = 0x22;
    if (ms_ctx != P2WSH) {
      if (ms_ctx != TAPSCRIPT) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
      }
      sVar3 = 0x21;
    }
    break;
  case PK_H:
    sVar3 = 0x18;
    break;
  case OLDER:
  case AFTER:
    BuildScript<unsigned_int&>((CScript *)&local_40.indirect_contents,&local_64);
    uVar2 = local_24 - 0x1d;
    if (local_24 < 0x1d) {
      uVar2 = local_24;
    }
    sVar3 = (size_t)(uVar2 + 1);
    if (0x1c < local_24) {
      free(local_40.indirect_contents.indirect);
    }
    break;
  case SHA256:
  case HASH256:
    sVar3 = 0x27;
    break;
  case RIPEMD160:
  case HASH160:
    sVar3 = 0x1b;
    break;
  case WRAP_A:
  case OR_C:
    subsize = subsize + 2;
  case AND_V:
switchD_0018d72a_caseD_11:
    sVar3 = subsize;
    break;
  case WRAP_S:
  case WRAP_C:
  case WRAP_N:
  case AND_B:
  case OR_B:
    subsize = subsize + 1;
    goto switchD_0018d72a_caseD_11;
  case WRAP_D:
  case OR_D:
  case OR_I:
  case ANDOR:
    subsize = subsize + 3;
    goto switchD_0018d72a_caseD_11;
  case WRAP_V:
    subsize = subsize + ((sub0typ.m_flags >> 0xd & 1) != 0);
    goto switchD_0018d72a_caseD_11;
  case WRAP_J:
    subsize = subsize + 4;
    goto switchD_0018d72a_caseD_11;
  case THRESH:
    BuildScript<unsigned_int&>((CScript *)&local_40.indirect_contents,&local_64);
    uVar2 = local_24 - 0x1d;
    if (local_24 < 0x1d) {
      uVar2 = local_24;
    }
    if (local_24 >= 0x1d) {
      free(local_40.indirect_contents.indirect);
    }
    sVar3 = n_subs + subsize + (ulong)uVar2;
    break;
  case MULTI:
    BuildScript<unsigned_long&>((CScript *)&local_40.indirect_contents,&local_70);
    uVar1 = local_24;
    BuildScript<unsigned_int&>((CScript *)&local_60.indirect_contents,&local_64);
    sVar3 = local_70;
    uVar2 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
    }
    uVar1 = local_44 - 0x1d;
    if (local_44 < 0x1d) {
      uVar1 = local_44;
    }
    if (0x1c < local_44) {
      free(local_60.indirect_contents.indirect);
    }
    if (0x1c < local_24) {
      free(local_40.indirect_contents.indirect);
    }
    sVar3 = sVar3 * 0x22 + (ulong)(uVar2 + uVar1 + 1);
    break;
  case MULTI_A:
    BuildScript<unsigned_int&>((CScript *)&local_40.indirect_contents,&local_64);
    uVar2 = local_24 - 0x1d;
    if (local_24 < 0x1d) {
      uVar2 = local_24;
    }
    if (local_24 >= 0x1d) {
      free(local_40.indirect_contents.indirect);
    }
    sVar3 = (ulong)uVar2 + n_keys * 0x22 + 1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x125,
                  "size_t miniscript::internal::ComputeScriptLen(Fragment, Type, size_t, uint32_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return sVar3;
}

Assistant:

size_t ComputeScriptLen(Fragment fragment, Type sub0typ, size_t subsize, uint32_t k, size_t n_subs,
                        size_t n_keys, MiniscriptContext ms_ctx) {
    switch (fragment) {
        case Fragment::JUST_1:
        case Fragment::JUST_0: return 1;
        case Fragment::PK_K: return IsTapscript(ms_ctx) ? 33 : 34;
        case Fragment::PK_H: return 3 + 21;
        case Fragment::OLDER:
        case Fragment::AFTER: return 1 + BuildScript(k).size();
        case Fragment::HASH256:
        case Fragment::SHA256: return 4 + 2 + 33;
        case Fragment::HASH160:
        case Fragment::RIPEMD160: return 4 + 2 + 21;
        case Fragment::MULTI: return 1 + BuildScript(n_keys).size() + BuildScript(k).size() + 34 * n_keys;
        case Fragment::MULTI_A: return (1 + 32 + 1) * n_keys + BuildScript(k).size() + 1;
        case Fragment::AND_V: return subsize;
        case Fragment::WRAP_V: return subsize + (sub0typ << "x"_mst);
        case Fragment::WRAP_S:
        case Fragment::WRAP_C:
        case Fragment::WRAP_N:
        case Fragment::AND_B:
        case Fragment::OR_B: return subsize + 1;
        case Fragment::WRAP_A:
        case Fragment::OR_C: return subsize + 2;
        case Fragment::WRAP_D:
        case Fragment::OR_D:
        case Fragment::OR_I:
        case Fragment::ANDOR: return subsize + 3;
        case Fragment::WRAP_J: return subsize + 4;
        case Fragment::THRESH: return subsize + n_subs + BuildScript(k).size();
    }
    assert(false);
}